

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPLoader.cpp
# Opt level: O0

bool __thiscall
Assimp::HMPImporter::CanRead(HMPImporter *this,string *pFile,IOSystem *pIOHandler,bool cs)

{
  bool bVar1;
  long lVar2;
  undefined4 local_6c;
  undefined4 local_68;
  uint32_t tokens [3];
  undefined1 local_50 [8];
  string extension;
  bool cs_local;
  IOSystem *pIOHandler_local;
  string *pFile_local;
  HMPImporter *this_local;
  
  extension.field_2._M_local_buf[0xf] = cs;
  BaseImporter::GetExtension((string *)local_50,pFile);
  bVar1 = std::operator==((string *)local_50,"hmp");
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    lVar2 = std::__cxx11::string::length();
    if ((lVar2 == 0) || ((extension.field_2._M_local_buf[0xf] & 1U) != 0)) {
      local_6c = 0x34504d48;
      local_68 = 0x35504d48;
      tokens[0] = 0x37504d48;
      this_local._7_1_ = BaseImporter::CheckMagicToken(pIOHandler,pFile,&local_6c,3,0,4);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  tokens[1] = 1;
  std::__cxx11::string::~string((string *)local_50);
  return this_local._7_1_;
}

Assistant:

bool HMPImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool cs) const
{
    const std::string extension = GetExtension(pFile);
    if (extension == "hmp" )
        return true;

    // if check for extension is not enough, check for the magic tokens
    if (!extension.length() || cs) {
        uint32_t tokens[3];
        tokens[0] = AI_HMP_MAGIC_NUMBER_LE_4;
        tokens[1] = AI_HMP_MAGIC_NUMBER_LE_5;
        tokens[2] = AI_HMP_MAGIC_NUMBER_LE_7;
        return CheckMagicToken(pIOHandler,pFile,tokens,3,0);
    }
    return false;
}